

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplace_back<slang::ast::LValue::BitSlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,BitSlice *args)

{
  size_type sVar1;
  ulong uVar2;
  pointer pvVar3;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var4;
  size_type sVar5;
  ConstantRange *ctx;
  ConstantRange *__rhs;
  ConstantRange *__rhs_00;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var6;
  long lVar7;
  ConstantRange *pCVar8;
  
  __rhs = (ConstantRange *)(this->data_ + this->len);
  if (this->len != this->cap) {
    *__rhs = args->range;
    *(__index_type *)&__rhs[10].left = '\0';
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  pCVar8 = (ConstantRange *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (ConstantRange *)(uVar2 * 2);
  if (pCVar8 < ctx) {
    pCVar8 = ctx;
  }
  if (0x1745d1745d1745d - uVar2 < uVar2) {
    pCVar8 = (ConstantRange *)0x1745d1745d1745d;
  }
  lVar7 = (long)__rhs - (long)this->data_;
  p_Var4 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)operator_new((long)pCVar8 * 0x58);
  *(ConstantRange *)((long)p_Var4 + lVar7) = args->range;
  *(undefined1 *)((long)p_Var4 + lVar7 + 0x50) = 0;
  __rhs_00 = (ConstantRange *)this->data_;
  sVar1 = this->len;
  sVar5 = sVar1 * 0x58;
  p_Var6 = p_Var4;
  if (__rhs_00 + sVar1 * 0xb == __rhs) {
    while (sVar1 != 0) {
      ctx = __rhs_00;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs_00);
      __rhs_00 = __rhs_00 + 0xb;
      sVar5 = sVar5 - 0x58;
      p_Var6 = p_Var6 + 1;
      sVar1 = sVar5;
    }
  }
  else {
    for (; __rhs_00 != __rhs; __rhs_00 = __rhs_00 + 0xb) {
      ctx = __rhs_00;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs_00);
      p_Var6 = p_Var6 + 1;
    }
    sVar1 = this->len;
    pvVar3 = this->data_;
    if ((ConstantRange *)(pvVar3 + sVar1) != __rhs) {
      p_Var6 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)(lVar7 + (long)p_Var4);
      do {
        p_Var6 = p_Var6 + 1;
        ctx = __rhs;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs);
        __rhs = __rhs + 0xb;
      } while (__rhs != (ConstantRange *)(pvVar3 + sVar1));
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pCVar8;
  this->data_ = (pointer)p_Var4;
  return (reference)((long)p_Var4 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }